

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O3

void __thiscall t_swift_generator::~t_swift_generator(t_swift_generator *this)

{
  pointer pcVar1;
  
  (this->super_t_oop_generator).super_t_generator._vptr_t_generator =
       (_func_int **)&PTR__t_swift_generator_00411ed8;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&(this->swift_reserved_words_)._M_t);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  ~template_ofstream_with_content_based_conditional_update
            (&this->f_impl_,
             &template_ofstream_with_content_based_conditional_update<char,std::char_traits<char>>::
              VTT);
  std::ios_base::~ios_base
            ((ios_base *)
             &(this->f_impl_).super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>
              .field_0x98);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  ~template_ofstream_with_content_based_conditional_update
            (&this->f_decl_,
             &template_ofstream_with_content_based_conditional_update<char,std::char_traits<char>>::
              VTT);
  std::ios_base::~ios_base
            ((ios_base *)
             &(this->f_decl_).super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>
              .field_0x98);
  pcVar1 = (this->constants_declarations_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->constants_declarations_).field_2) {
    operator_delete(pcVar1);
  }
  t_generator::~t_generator((t_generator *)this);
  operator_delete(this);
  return;
}

Assistant:

t_swift_generator(t_program* program,
                    const map<string, string>& parsed_options,
                    const string& option_string)
    : t_oop_generator(program) {
    update_keywords();
	
    (void)option_string;
    map<string, string>::const_iterator iter;

    log_unexpected_ = false;
    async_clients_ = false;
    debug_descriptions_ = false;
    no_strict_ = false;
    namespaced_ = false;
    gen_cocoa_ = false;
    promise_kit_ = false;
    safe_enums_ = false;

    for( iter = parsed_options.begin(); iter != parsed_options.end(); ++iter) {
      if( iter->first.compare("log_unexpected") == 0) {
        log_unexpected_ = true;
      } else if( iter->first.compare("async_clients") == 0) {
        async_clients_ = true;
      } else if( iter->first.compare("no_strict") == 0) {
        no_strict_ = true;
      } else if( iter->first.compare("debug_descriptions") == 0) {
        debug_descriptions_ = true;
      } else if( iter->first.compare("namespaced") == 0) {
        namespaced_ = true;
      } else if( iter->first.compare("cocoa") == 0) {
        gen_cocoa_ = true;
      } else if( iter->first.compare("safe_enums") == 0) {
        safe_enums_ = true;
      } else if( iter->first.compare("promise_kit") == 0) {
        if (gen_cocoa_ == false) {
          throw "PromiseKit only available with Swift 2.x, use `cocoa` option" + iter->first;
        }
        promise_kit_ = true;
      } else {
        throw "unknown option swift:" + iter->first;
      }
    }

    out_dir_base_ = "gen-swift";
  }